

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateFractionStem
               (int32_t minFrac,int32_t maxFrac,UnicodeString *sb,UErrorCode *param_4)

{
  ConstChar16Ptr local_28;
  UErrorCode *local_20;
  UErrorCode *param_3_local;
  UnicodeString *sb_local;
  int32_t maxFrac_local;
  int32_t minFrac_local;
  
  local_20 = param_4;
  param_3_local = (UErrorCode *)sb;
  sb_local._0_4_ = maxFrac;
  sb_local._4_4_ = minFrac;
  if ((minFrac == 0) && (maxFrac == 0)) {
    ConstChar16Ptr::ConstChar16Ptr(&local_28,L"precision-integer");
    UnicodeString::append(sb,&local_28,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  }
  else {
    UnicodeString::append(sb,L'.');
    anon_unknown.dwarf_151918::appendMultiple((UnicodeString *)param_3_local,0x30,sb_local._4_4_);
    if ((int32_t)sb_local == -1) {
      UnicodeString::append((UnicodeString *)param_3_local,L'+');
    }
    else {
      anon_unknown.dwarf_151918::appendMultiple
                ((UnicodeString *)param_3_local,0x23,(int32_t)sb_local - sb_local._4_4_);
    }
  }
  return;
}

Assistant:

void
blueprint_helpers::generateFractionStem(int32_t minFrac, int32_t maxFrac, UnicodeString& sb, UErrorCode&) {
    if (minFrac == 0 && maxFrac == 0) {
        sb.append(u"precision-integer", -1);
        return;
    }
    sb.append(u'.');
    appendMultiple(sb, u'0', minFrac);
    if (maxFrac == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxFrac - minFrac);
    }
}